

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::ExpParameter::MergePartialFromCodedStream(ExpParameter *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  ExpParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    while( true ) {
      kMax1ByteVarint = 0x7f;
      tag_2 = 0;
      _first_byte_or_zero = input;
      if ((input->buffer_ < input->buffer_end_) &&
         (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
        local_3d = local_3c[0] - 1 < kMax1ByteVarint;
        pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      tag_00 = local_10;
      if ((uStack_c & 1) == 0) goto LAB_007906a2;
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 != 1) break;
      if ((tag_00 & 0xff) != 0xd) goto LAB_007906a2;
      set_has_base(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,&this->base_);
joined_r0x00790696:
      if (!bVar1) {
        return false;
      }
    }
    if (iVar2 != 2) {
      if ((iVar2 == 3) && ((tag_00 & 0xff) == 0x1d)) {
        set_has_shift(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&this->shift_);
        goto joined_r0x00790696;
      }
LAB_007906a2:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar1 = google::protobuf::internal::WireFormat::SkipField(input,tag_00,unknown_fields);
      goto joined_r0x00790696;
    }
    if ((tag_00 & 0xff) != 0x15) goto LAB_007906a2;
    set_has_scale(this);
    bVar1 = google::protobuf::internal::WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,&this->scale_);
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ExpParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ExpParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional float base = 1 [default = -1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {
          set_has_base();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &base_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float shift = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_shift();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &shift_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ExpParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ExpParameter)
  return false;
#undef DO_
}